

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O3

StringHashPair GeneratedSaxParser::Utils::calculateStringHashWithNamespace(ParserChar *text)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  uint uVar4;
  StringHashPair SVar5;
  
  uVar1 = 0;
  uVar3 = 0;
  do {
    cVar2 = *text;
    if (cVar2 == ':') {
      cVar2 = text[1];
      if (cVar2 == '\0') {
        cVar2 = ':';
      }
      else {
        text = text + 1;
        uVar1 = uVar3;
        uVar3 = 0;
      }
    }
    else if (cVar2 == '\0') {
      SVar5.second = uVar3;
      SVar5.first = uVar1;
      return SVar5;
    }
    text = text + 1;
    uVar3 = (long)cVar2 + uVar3 * 0x10;
    uVar4 = (uint)uVar3 & 0xf0000000;
    uVar3 = ~(ulong)uVar4 & (uVar4 >> 0x18 ^ uVar3);
  } while( true );
}

Assistant:

StringHashPair Utils::calculateStringHashWithNamespace( const ParserChar* text )
    {
        StringHash h = 0;
        StringHash g;
        const ParserChar* pos = text;
        StringHashPair pair;
        pair.first = 0;

        while (*pos != 0) {
            if (*pos == ':' && pos[1] != 0) {
                pair.first = h;
                h = 0;
                pos++;
            }
            h = (h << 4) + *pos++;
            if ((g = (h & 0xf0000000)) != 0)
                h ^= g >> 24;
            h &= ~g;
        }
        pair.second = h;
        return pair;
    }